

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_radixsort.h
# Opt level: O0

void gim_down_heap<GIM_RSORT_TOKEN,GIM_RSORT_TOKEN_COMPARATOR>
               (long param_1,uint param_2,uint param_3)

{
  int iVar1;
  int child;
  GIM_RSORT_TOKEN temp;
  uint local_24;
  GIM_RSORT_TOKEN local_20;
  uint local_18;
  uint local_14;
  long local_10;
  GIM_RSORT_TOKEN_COMPARATOR local_1;
  
  local_18 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  GIM_RSORT_TOKEN::GIM_RSORT_TOKEN
            (&local_20,(GIM_RSORT_TOKEN *)(param_1 + (ulong)(param_2 - 1) * 8));
  while (local_14 <= local_18 >> 1) {
    local_24 = local_14 * 2;
    if (((int)local_24 < (int)local_18) &&
       (iVar1 = GIM_RSORT_TOKEN_COMPARATOR::operator()
                          (&local_1,(GIM_RSORT_TOKEN *)(local_10 + (long)(int)(local_24 - 1) * 8),
                           (GIM_RSORT_TOKEN *)(local_10 + (long)(int)local_24 * 8)), iVar1 < 0)) {
      local_24 = local_24 + 1;
    }
    iVar1 = GIM_RSORT_TOKEN_COMPARATOR::operator()
                      (&local_1,&local_20,
                       (GIM_RSORT_TOKEN *)(local_10 + (long)(int)(local_24 - 1) * 8));
    if (-1 < iVar1) break;
    *(undefined8 *)(local_10 + (ulong)(local_14 - 1) * 8) =
         *(undefined8 *)(local_10 + (long)(int)(local_24 - 1) * 8);
    local_14 = local_24;
  }
  *(GIM_RSORT_TOKEN *)(local_10 + (ulong)(local_14 - 1) * 8) = local_20;
  return;
}

Assistant:

void gim_down_heap(T *pArr, GUINT k, GUINT n,COMP_CLASS CompareFunc)
{
	/*  PRE: a[k+1..N] is a heap */
	/* POST:  a[k..N]  is a heap */

	T temp = pArr[k - 1];
	/* k has child(s) */
	while (k <= n/2)
	{
		int child = 2*k;

		if ((child < (int)n) && CompareFunc(pArr[child - 1] , pArr[child])<0)
		{
			child++;
		}
		/* pick larger child */
		if (CompareFunc(temp , pArr[child - 1])<0)
		{
			/* move child up */
			pArr[k - 1] = pArr[child - 1];
			k = child;
		}
		else
		{
			break;
		}
	}
	pArr[k - 1] = temp;
}